

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O1

void __thiscall
flatbuffers::java::JavaGenerator::GenVectorAccessObject
          (JavaGenerator *this,StructDef *struct_def,string *code)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  FieldDef *pFVar3;
  const_iterator cVar4;
  long *plVar5;
  pointer ppFVar6;
  long *plVar7;
  size_type *psVar8;
  Value *type;
  bool bVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  string method_indent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> method_start;
  string type_name;
  _Alloc_hider local_130;
  StructDef *local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::append((char *)code);
  std::__cxx11::string::append((char *)code);
  local_130._M_p = (pointer)&local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"private","");
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                  *)&(struct_def->super_Definition).attributes,(key_type *)&local_130);
  if ((_Rb_tree_header *)cVar4._M_node ==
      &(struct_def->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
    bVar9 = true;
  }
  else {
    bVar9 = *(long *)(cVar4._M_node + 2) == 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_p != &local_120) {
    operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
  }
  if (bVar9) {
    std::__cxx11::string::append((char *)code);
  }
  std::__cxx11::string::append((char *)code);
  std::__cxx11::string::append((char *)code);
  std::__cxx11::string::append((char *)code);
  std::__cxx11::string::append((char *)code);
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"    ","");
  local_130._M_p = (pointer)&local_120;
  std::__cxx11::string::_M_construct<char*>((string *)&local_130,local_b0,local_a8 + (long)local_b0)
  ;
  std::__cxx11::string::append((char *)&local_130);
  std::__cxx11::string::_M_append((char *)code,(ulong)local_130._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_p != &local_120) {
    operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)code);
  std::__cxx11::string::append((char *)code);
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_50,&this->namer_,struct_def);
  paVar1 = &local_f0.field_2;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f0,local_b0,local_a8 + (long)local_b0);
  std::__cxx11::string::append((char *)&local_f0);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_f0,(ulong)local_50._M_dataplus._M_p);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_120._M_allocated_capacity = *plVar7;
    local_120._8_8_ = plVar5[3];
    local_130._M_p = (pointer)&local_120;
  }
  else {
    local_120._M_allocated_capacity = *plVar7;
    local_130._M_p = (pointer)*plVar5;
  }
  local_128 = (StructDef *)plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
  local_70 = &local_60;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_60 = *plVar7;
    lStack_58 = plVar5[3];
  }
  else {
    local_60 = *plVar7;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_p != &local_120) {
    operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  local_130._M_p = (pointer)&local_120;
  std::__cxx11::string::_M_construct<char*>((string *)&local_130,local_70,local_68 + (long)local_70)
  ;
  std::__cxx11::string::append((char *)&local_130);
  std::__cxx11::string::_M_append((char *)code,(ulong)local_130._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_p != &local_120) {
    operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
  }
  std::operator+(&local_f0,"(new ",&local_50);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_120._M_allocated_capacity = *plVar7;
    local_120._8_8_ = plVar5[3];
    local_130._M_p = (pointer)&local_120;
  }
  else {
    local_120._M_allocated_capacity = *plVar7;
    local_130._M_p = (pointer)*plVar5;
  }
  local_128 = (StructDef *)plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code,(ulong)local_130._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_p != &local_120) {
    operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_70,local_68 + (long)local_70);
  std::__cxx11::string::append((char *)&local_d0);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_d0,(ulong)local_50._M_dataplus._M_p);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_f0.field_2._M_allocated_capacity = *psVar8;
    local_f0.field_2._8_8_ = plVar5[3];
    local_f0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar8;
    local_f0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_f0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_120._M_allocated_capacity = *plVar7;
    local_120._8_8_ = plVar5[3];
    local_130._M_p = (pointer)&local_120;
  }
  else {
    local_120._M_allocated_capacity = *plVar7;
    local_130._M_p = (pointer)*plVar5;
  }
  local_128 = (StructDef *)plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code,(ulong)local_130._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_p != &local_120) {
    operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)code);
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"__element(j)","");
  bVar9 = struct_def->fixed;
  if (bVar9 == true) {
    local_130._M_p = (pointer)&local_120;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,local_f0._M_dataplus._M_p,
               local_f0._M_dataplus._M_p + local_f0._M_string_length);
  }
  else {
    std::operator+(&local_d0,"__indirect(",&local_f0);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_120._M_allocated_capacity = *plVar7;
      local_120._8_8_ = plVar5[3];
      local_130._M_p = (pointer)&local_120;
    }
    else {
      local_120._M_allocated_capacity = *plVar7;
      local_130._M_p = (pointer)*plVar5;
    }
    local_128 = (StructDef *)plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
  }
  std::__cxx11::string::_M_append((char *)code,(ulong)local_130._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_p != &local_120) {
    operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
  }
  if ((bVar9 == false) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2)) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)code);
  if (struct_def->fixed == false) {
    for (ppFVar6 = (struct_def->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppFVar6 !=
        (struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppFVar6 = ppFVar6 + 1) {
      pFVar3 = *ppFVar6;
      if (pFVar3->key == true) {
        local_130._M_p = (pointer)&local_120;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,local_b0,local_a8 + (long)local_b0,"@Nullable ");
        std::__cxx11::string::append((char *)&local_130);
        std::__cxx11::string::_M_append((char *)code,(ulong)local_130._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_p != &local_120) {
          operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
        }
        std::operator+(&local_110,"public ",&local_50);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_120._M_allocated_capacity = *plVar7;
          local_120._8_8_ = plVar5[3];
          local_130._M_p = (pointer)&local_120;
        }
        else {
          local_120._M_allocated_capacity = *plVar7;
          local_130._M_p = (pointer)*plVar5;
        }
        local_128 = (StructDef *)plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code,(ulong)local_130._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_p != &local_120) {
          operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)code);
        type = &pFVar3->value;
        DestinationType((Type *)&local_130,this,&type->type,true);
        GenTypeGet_abi_cxx11_(&local_90,this,(Type *)&local_130);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_110.field_2._M_allocated_capacity = *psVar8;
          local_110.field_2._8_8_ = plVar5[3];
        }
        else {
          local_110.field_2._M_allocated_capacity = *psVar8;
          local_110._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_110._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code,(ulong)local_110._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)code);
        std::__cxx11::string::append((char *)code);
        std::__cxx11::string::append((char *)code);
        std::__cxx11::string::append((char *)code);
        local_130._M_p = (pointer)&local_120;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,local_b0,local_a8 + (long)local_b0);
        std::__cxx11::string::append((char *)&local_130);
        std::__cxx11::string::_M_append((char *)code,(ulong)local_130._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_p != &local_120) {
          operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
        }
        std::operator+(&local_110,"public ",&local_50);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_120._M_allocated_capacity = *plVar7;
          local_120._8_8_ = plVar5[3];
          local_130._M_p = (pointer)&local_120;
        }
        else {
          local_120._M_allocated_capacity = *plVar7;
          local_130._M_p = (pointer)*plVar5;
        }
        local_128 = (StructDef *)plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code,(ulong)local_130._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_p != &local_120) {
          operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)code);
        local_130._M_p = (pointer)&local_120;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,local_50._M_dataplus._M_p,
                   local_50._M_dataplus._M_p + local_50._M_string_length);
        std::__cxx11::string::append((char *)&local_130);
        std::__cxx11::string::_M_append((char *)code,(ulong)local_130._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_p != &local_120) {
          operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
        }
        DestinationType((Type *)&local_130,this,&type->type,true);
        GenTypeGet_abi_cxx11_(&local_90,this,(Type *)&local_130);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_110.field_2._M_allocated_capacity = *psVar8;
          local_110.field_2._8_8_ = plVar5[3];
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        }
        else {
          local_110.field_2._M_allocated_capacity = *psVar8;
          local_110._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_110._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code,(ulong)local_110._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)code);
        std::__cxx11::string::append((char *)code);
        std::__cxx11::string::append((char *)code);
        std::__cxx11::string::append((char *)code);
        break;
      }
    }
  }
  std::__cxx11::string::append((char *)code);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  return;
}

Assistant:

void GenVectorAccessObject(StructDef &struct_def, std::string &code) const {
    // Generate a vector of structs accessor class.
    code += "\n";
    code += "  ";
    if (!struct_def.attributes.Lookup("private")) code += "public ";
    code += "static ";
    code += "final ";
    code += "class Vector extends ";
    code += "BaseVector {\n";

    // Generate the __assign method that sets the field in a pre-existing
    // accessor object. This is to allow object reuse.
    std::string method_indent = "    ";
    code += method_indent + "public Vector ";
    code += "__assign(int _vector, int _element_size, ByteBuffer _bb) { ";
    code += "__reset(_vector, _element_size, _bb); return this; }\n\n";

    auto type_name = namer_.Type(struct_def);
    auto method_start = method_indent + "public " + type_name + " get";
    // Generate the accessors that don't do object reuse.
    code += method_start + "(int j) { return get";
    code += "(new " + type_name + "(), j); }\n";
    code += method_start + "(" + type_name + " obj, int j) { ";
    code += " return obj.__assign(";
    std::string index = "__element(j)";
    code += struct_def.fixed ? index : "__indirect(" + index + ", bb)";
    code += ", bb); }\n";
    // See if we should generate a by-key accessor.
    if (!struct_def.fixed) {
      auto &fields = struct_def.fields.vec;
      for (auto kit = fields.begin(); kit != fields.end(); ++kit) {
        auto &key_field = **kit;
        if (key_field.key) {
          auto nullable_annotation =
              parser_.opts.gen_nullable ? "@Nullable " : "";
          code += method_indent + nullable_annotation;
          code += "public " + type_name + " ";
          code += "getByKey(";
          code += GenTypeNameDest(key_field.value.type) + " key) { ";
          code += " return __lookup_by_key(null, ";
          code += "__vector(), key, ";
          code += "bb); ";
          code += "}\n";
          code += method_indent + nullable_annotation;
          code += "public " + type_name + " ";
          code += "getByKey(";
          code += type_name + " obj, ";
          code += GenTypeNameDest(key_field.value.type) + " key) { ";
          code += " return __lookup_by_key(obj, ";
          code += "__vector(), key, ";
          code += "bb); ";
          code += "}\n";
          break;
        }
      }
    }
    code += "  }\n";
  }